

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O2

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  xmlNodePtr cur_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *__s2;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  _xmlNode **pp_Var13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int level_00;
  uint uVar18;
  char **ppcVar19;
  char *local_280;
  long local_278;
  long local_268;
  long local_260;
  long local_240;
  char buf [500];
  
  level_00 = 2;
  if (level == 1) {
    level_00 = 2;
    lVar5 = xmlGetProp(cur,"PROFILE");
    if (lVar5 != 0) {
      printf("Test cases: %s\n",lVar5);
      (*_xmlFree)(lVar5);
      bVar2 = 1;
      goto LAB_001028c2;
    }
    level_00 = 1;
  }
  bVar2 = 0;
LAB_001028c2:
  pp_Var13 = &cur->children;
  iVar16 = 0;
  uVar15 = 0;
  do {
    cur_00 = *pp_Var13;
    if (cur_00 == (xmlNodePtr)0x0) {
      if ((bool)(bVar2 & 0 < (int)uVar15)) {
        printf("Test cases: %d tests\n",(ulong)uVar15);
      }
      return iVar16;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      iVar3 = xmlStrEqual(cur_00->name,"TESTCASES");
      if (iVar3 == 0) {
        iVar3 = xmlStrEqual(cur_00->name,"TEST");
        if (iVar3 == 0) {
          fprintf(_stderr,"Unhandled element %s\n",cur_00->name);
        }
        else {
          testErrorsSize = 0;
          nbError = 0;
          testErrors[0] = '\0';
          nbFatal = 0;
          __s2 = (char *)xmlGetProp(cur_00,"ID");
          if (__s2 == (char *)0x0) {
            uVar6 = xmlGetLineNo(cur_00);
            test_log("test missing ID, line %ld\n",uVar6);
          }
          else {
            ppcVar19 = skipped_tests;
            do {
              if (*ppcVar19 == (char *)0x0) {
                lVar5 = xmlGetProp(cur_00,"TYPE");
                if (lVar5 == 0) {
                  test_log("test %s missing TYPE\n",__s2);
                  uVar18 = 0xffffffff;
                  goto LAB_00102b7c;
                }
                pcVar7 = (char *)xmlGetProp(cur_00,"URI");
                if (pcVar7 == (char *)0x0) {
                  test_log("test %s missing URI\n",__s2);
                  local_280 = (char *)0x0;
                  local_240 = 0;
LAB_00102beb:
                  lVar9 = 0;
                  local_260 = 0;
                  lVar8 = 0;
                  local_268 = 0;
                  uVar18 = 0xffffffff;
                }
                else {
                  local_240 = xmlNodeGetBase(doc,cur_00);
                  pcVar14 = pcVar7;
                  if (local_240 != 0) {
                    pcVar14 = buf;
                    snprintf(pcVar14,500,"%s/%s",local_240,pcVar7);
                  }
                  local_280 = (char *)xmlStrdup(pcVar14);
                  iVar3 = checkTestFile(local_280);
                  if (iVar3 == 0) {
                    pcVar14 = local_280;
                    if (local_280 == (char *)0x0) {
                      pcVar14 = "NULL";
                    }
                    test_log("test %s missing file %s \n",__s2,pcVar14);
                    goto LAB_00102beb;
                  }
                  local_260 = xmlGetProp(cur_00,"VERSION");
                  lVar8 = xmlGetProp(cur_00,"ENTITIES");
                  iVar3 = xmlStrEqual(lVar8,"none");
                  uVar17 = 0;
                  if (iVar3 == 0) {
                    uVar17 = 6;
                  }
                  lVar9 = xmlGetProp(cur_00,"RECOMMENDATION");
                  if ((((lVar9 == 0) || (iVar3 = xmlStrEqual(lVar9,"XML1.0"), iVar3 != 0)) ||
                      (iVar3 = xmlStrEqual(lVar9,"XML1.0-errata2e"), iVar3 != 0)) ||
                     ((iVar3 = xmlStrEqual(lVar9,"XML1.0-errata3e"), iVar3 != 0 ||
                      (iVar3 = xmlStrEqual(lVar9,"XML1.0-errata4e"), iVar3 != 0)))) {
                    bVar1 = true;
                    if ((local_260 == 0) || (iVar3 = xmlStrEqual(local_260,"1.0"), iVar3 != 0))
                    goto LAB_00102c2f;
                    local_268 = 0;
                    test_log("Skipping test %s for %s\n",__s2,local_260);
                    nb_skipped = nb_skipped + 1;
                    uVar18 = 0;
                  }
                  else {
                    iVar3 = xmlStrEqual(lVar9,"NS1.0");
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(lVar9,"NS1.0-errata1e");
                      uVar18 = 0;
                      bVar1 = false;
                      if (iVar3 == 0) {
                        test_log("Skipping test %s for REC %s\n",__s2,lVar9);
                        nb_skipped = nb_skipped + 1;
                        local_268 = 0;
                        goto LAB_00102f27;
                      }
                    }
                    else {
                      bVar1 = false;
                    }
LAB_00102c2f:
                    local_268 = xmlGetProp(cur_00,"EDITION");
                    uVar18 = uVar17;
                    if (local_268 != 0) {
                      lVar10 = xmlStrchr(local_268,0x35);
                      uVar18 = uVar17 + 0x20000;
                      if (lVar10 != 0) {
                        uVar18 = uVar17;
                      }
                    }
                    xmlResetLastError();
                    testErrorsSize = 0;
                    testErrors[0] = '\0';
                    iVar3 = xmlMemUsed();
                    iVar4 = xmlStrEqual(lVar5,"not-wf");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(lVar5,"valid");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(lVar5,"invalid");
                        if (iVar4 == 0) {
                          iVar3 = xmlStrEqual(lVar5,"error");
                          if (iVar3 == 0) {
                            test_log("test %s unknown TYPE value %s\n",__s2,lVar5);
                            uVar18 = 0xffffffff;
                          }
                          else {
                            uVar18 = 0;
                            test_log("Skipping error test %s \n",__s2);
                            nb_skipped = nb_skipped + 1;
                          }
                          goto LAB_00102f27;
                        }
                        local_278 = xmlNewParserCtxt();
                        if (local_278 != 0) {
                          lVar10 = xmlCtxtReadFile(local_278,local_280,0,uVar18 | 0x10);
                          if (lVar10 != 0) {
                            if ((*(int *)(local_278 + 0x98) != 0) ||
                               ((*(byte *)(lVar10 + 0xac) & 8) != 0)) {
                              pcVar14 = "test %s : %s failed to detect invalid document\n";
                              goto LAB_00102dff;
                            }
                            goto LAB_00102e14;
                          }
                          test_log("test %s : %s invalid document turned not well-formed too\n",__s2
                                   ,local_280);
                          goto LAB_00102ece;
                        }
                      }
                      else {
                        local_278 = xmlNewParserCtxt();
                        if (local_278 != 0) {
                          lVar10 = xmlCtxtReadFile(local_278,local_280,0,uVar18 | 0x10);
                          if (lVar10 == 0) {
                            test_log("test %s : %s failed to parse a valid document\n",__s2,
                                     local_280);
                            nb_errors = nb_errors + 1;
                          }
                          else {
                            if ((*(int *)(local_278 + 0x98) == 0) ||
                               ((*(byte *)(lVar10 + 0xac) & 8) == 0)) {
                              pcVar14 = "test %s : %s failed to validate a valid document\n";
LAB_00102dff:
                              test_log(pcVar14,__s2,local_280);
                              nb_errors = nb_errors + 1;
                            }
LAB_00102e14:
                            xmlFreeDoc(lVar10);
                          }
LAB_00102ece:
                          xmlFreeParserCtxt(local_278);
                          goto LAB_00102ed6;
                        }
                      }
                      test_log("test %s : %s out of memory\n",__s2,local_280);
                    }
                    else {
                      lVar10 = xmlReadFile(local_280,0,uVar18);
                      if (bVar1) {
                        if (lVar10 != 0) {
                          pcVar14 = "test %s : %s failed to detect not well formedness\n";
LAB_00102d7a:
                          test_log(pcVar14,__s2,local_280);
                          nb_errors = nb_errors + 1;
LAB_00102d87:
                          xmlFreeDoc(lVar10);
                        }
                      }
                      else {
                        if (lVar10 != 0) {
                          lVar11 = __xmlLastError();
                          if ((*(int *)(lVar11 + 4) == 0) ||
                             (piVar12 = (int *)__xmlLastError(), *piVar12 != 3)) {
                            pcVar14 = "test %s : %s failed to detect namespace error\n";
                            goto LAB_00102d7a;
                          }
                          goto LAB_00102d87;
                        }
                        test_log("test %s : %s failed to parse the XML\n",__s2,local_280);
                        nb_errors = nb_errors + 1;
                      }
                    }
LAB_00102ed6:
                    xmlResetLastError();
                    iVar4 = xmlMemUsed();
                    uVar18 = iVar4 - iVar3;
                    if (uVar18 != 0 && iVar3 <= iVar4) {
                      test_log("test %s : %s leaked %d bytes\n",__s2,local_280,(ulong)uVar18);
                      nb_leaks = nb_leaks + 1;
                      xmlMemDisplayLast(logfile,(long)(int)uVar18);
                    }
                    nb_tests = nb_tests + 1;
                    uVar18 = 1;
                  }
                }
LAB_00102f27:
                (*_xmlFree)(lVar5);
                if (lVar8 != 0) {
                  (*_xmlFree)(lVar8);
                }
                if (local_268 != 0) {
                  (*_xmlFree)();
                }
                if (local_260 != 0) {
                  (*_xmlFree)();
                }
                if (local_280 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (pcVar7 != (char *)0x0) {
                  (*_xmlFree)();
                }
                if (local_240 != 0) {
                  (*_xmlFree)();
                }
                goto LAB_00102faa;
              }
              iVar3 = strcmp(*ppcVar19,__s2);
              ppcVar19 = ppcVar19 + 1;
            } while (iVar3 != 0);
            uVar18 = 0;
            test_log("Skipping test %s from skipped list\n",__s2);
            nb_skipped = nb_skipped + 1;
LAB_00102b7c:
            lVar9 = 0;
LAB_00102faa:
            (*_xmlFree)(__s2);
            if (lVar9 != 0) {
              (*_xmlFree)(lVar9);
            }
            iVar16 = iVar16 - ((int)~uVar18 >> 0x1f);
          }
          uVar15 = uVar15 + 1;
        }
      }
      else {
        iVar3 = xmlconfTestCases(doc,cur_00,level_00);
        iVar16 = iVar16 + iVar3;
      }
    }
    pp_Var13 = &cur_00->next;
  } while( true );
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}